

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

path * GetDefaultDataDir(void)

{
  long lVar1;
  path *in_RDI;
  long in_FS_OFFSET;
  char *pszHome;
  path local_90;
  path local_68;
  path pathRet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&pathRet.super_path);
  pszHome = getenv("HOME");
  if ((pszHome == (char *)0x0) || (*pszHome == '\0')) {
    fs::path::path((path *)&local_68,"/");
  }
  else {
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&local_68,&pszHome,auto_format);
  }
  std::filesystem::__cxx11::path::operator=(&pathRet.super_path,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::path::path(&local_90,&pathRet.super_path);
  fs::path::operator/=((path *)&local_90,".bitcoin");
  std::filesystem::__cxx11::path::path(in_RDI,&local_90);
  std::filesystem::__cxx11::path::~path(&local_90);
  std::filesystem::__cxx11::path::~path(&pathRet.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

fs::path GetDefaultDataDir()
{
    // Windows:
    //   old: C:\Users\Username\AppData\Roaming\Bitcoin
    //   new: C:\Users\Username\AppData\Local\Bitcoin
    // macOS: ~/Library/Application Support/Bitcoin
    // Unix-like: ~/.bitcoin
#ifdef WIN32
    // Windows
    // Check for existence of datadir in old location and keep it there
    fs::path legacy_path = GetSpecialFolderPath(CSIDL_APPDATA) / "Bitcoin";
    if (fs::exists(legacy_path)) return legacy_path;

    // Otherwise, fresh installs can start in the new, "proper" location
    return GetSpecialFolderPath(CSIDL_LOCAL_APPDATA) / "Bitcoin";
#else
    fs::path pathRet;
    char* pszHome = getenv("HOME");
    if (pszHome == nullptr || strlen(pszHome) == 0)
        pathRet = fs::path("/");
    else
        pathRet = fs::path(pszHome);
#ifdef MAC_OSX
    // macOS
    return pathRet / "Library/Application Support/Bitcoin";
#else
    // Unix-like
    return pathRet / ".bitcoin";
#endif
#endif
}